

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_lib.cc
# Opt level: O1

ASN1_STRING * ASN1_STRING_dup(ASN1_STRING *a)

{
  int iVar1;
  ASN1_STRING *str;
  
  if (a != (ASN1_STRING *)0x0) {
    str = (ASN1_STRING *)OPENSSL_malloc(0x18);
    if (str == (ASN1_STRING *)0x0) {
      str = (ASN1_STRING *)0x0;
    }
    else {
      str->length = 0;
      str->type = 4;
      str->data = (uchar *)0x0;
      str->flags = 0;
    }
    if (str != (ASN1_STRING *)0x0) {
      iVar1 = ASN1_STRING_set(str,a->data,a->length);
      if (iVar1 != 0) {
        str->type = a->type;
        str->flags = a->flags;
        return str;
      }
      OPENSSL_free(str->data);
      OPENSSL_free(str);
    }
  }
  return (ASN1_STRING *)0x0;
}

Assistant:

ASN1_STRING *ASN1_STRING_dup(const ASN1_STRING *str) {
  ASN1_STRING *ret;
  if (!str) {
    return NULL;
  }
  ret = ASN1_STRING_new();
  if (!ret) {
    return NULL;
  }
  if (!ASN1_STRING_copy(ret, str)) {
    ASN1_STRING_free(ret);
    return NULL;
  }
  return ret;
}